

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O2

REF_STATUS
ref_recon_kexact_rs(REF_GLOB center_global,REF_CLOUD ref_cloud,REF_DBL *rn,REF_DBL *sn,
                   REF_DBL *hessian)

{
  REF_GLOB *pRVar1;
  uint uVar2;
  REF_STATUS RVar3;
  REF_DBL *pRVar4;
  REF_DBL *r;
  REF_DBL *pRVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 uVar8;
  ulong uVar9;
  REF_DBL *pRVar10;
  size_t __size;
  int iVar11;
  long lVar12;
  REF_GLOB RVar13;
  double *pdVar14;
  ulong uVar15;
  char *pcVar16;
  long lVar17;
  int iVar18;
  int m;
  double dVar19;
  double dVar20;
  uint local_114;
  ulong local_110;
  REF_DBL *local_108;
  ulong local_100;
  REF_GLOB local_f8;
  REF_DBL *local_f0;
  REF_DBL *local_e8;
  long local_e0;
  REF_DBL xyzs [4];
  double local_b8 [4];
  REF_DBL ab [12];
  
  uVar2 = ref_cloud_item(ref_cloud,center_global,(REF_INT *)&local_114);
  if (uVar2 == 0) {
    uVar2 = ref_cloud->naux;
    local_e0 = (long)(int)uVar2;
    uVar6 = 0;
    uVar9 = 0;
    if (0 < (int)uVar2) {
      uVar9 = (ulong)uVar2;
    }
    for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
      xyzs[uVar6] = ref_cloud->aux[(long)(int)(local_114 * uVar2) + uVar6];
    }
    uVar6 = (ulong)ref_cloud->n;
    if ((long)uVar6 < 4) {
      return 4;
    }
    uVar2 = ref_cloud->n - 1;
    local_100 = (ulong)uVar2;
    __size = (ulong)(uVar2 * 3) << 3;
    local_f8 = center_global;
    pRVar4 = (REF_DBL *)malloc(__size);
    if (pRVar4 == (REF_DBL *)0x0) {
      pcVar16 = "malloc a of REF_DBL NULL";
      uVar8 = 0x619;
    }
    else {
      local_108 = pRVar4;
      pRVar4 = (REF_DBL *)malloc(__size);
      if (pRVar4 == (REF_DBL *)0x0) {
        pcVar16 = "malloc q of REF_DBL NULL";
        uVar8 = 0x61a;
      }
      else {
        r = (REF_DBL *)malloc(0x48);
        if (r != (REF_DBL *)0x0) {
          pRVar1 = ref_cloud->global;
          uVar7 = local_100 & 0xffffffff;
          iVar18 = 0;
          uVar9 = 0;
          RVar13 = *pRVar1;
          while (uVar15 = uVar9, lVar12 = (long)iVar18, uVar15 != uVar6) {
            if (RVar13 != local_f8) {
              pRVar5 = ref_cloud->aux;
              lVar17 = uVar15 * local_e0;
              dVar20 = rn[2] * (pRVar5[lVar17 + 2] - xyzs[2]) +
                       *rn * (pRVar5[lVar17] - xyzs[0]) + rn[1] * (pRVar5[lVar17 + 1] - xyzs[1]);
              dVar19 = (pRVar5[lVar17 + 2] - xyzs[2]) * sn[2] +
                       (pRVar5[lVar17] - xyzs[0]) * *sn + (pRVar5[lVar17 + 1] - xyzs[1]) * sn[1];
              local_b8[0] = dVar20 * 0.5 * dVar20;
              local_b8[1] = dVar19 * dVar20;
              local_b8[2] = dVar19 * 0.5 * dVar19;
              pdVar14 = local_108 + lVar12;
              for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
                *pdVar14 = local_b8[lVar12];
                pdVar14 = pdVar14 + uVar7;
              }
              iVar18 = iVar18 + 1;
            }
            uVar9 = uVar15 + 1;
            RVar13 = -1;
            if (uVar9 < uVar6) {
              RVar13 = pRVar1[uVar15 + 1];
            }
          }
          local_114 = (uint)uVar15;
          m = (int)local_100;
          local_110 = uVar7;
          local_f0 = hessian;
          local_e8 = r;
          if (m != iVar18) {
            pcVar16 = "A row miscount";
            uVar8 = 0x62e;
LAB_001a141e:
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,uVar8,"ref_recon_kexact_rs",pcVar16,local_110,lVar12);
            return 1;
          }
          uVar2 = ref_matrix_qr(m,3,local_108,pRVar4,r);
          if (uVar2 == 0) {
            for (lVar12 = 0; lVar12 != 0xc; lVar12 = lVar12 + 1) {
              ab[lVar12] = 0.0;
            }
            pRVar5 = ab;
            pRVar10 = r;
            for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
              for (lVar17 = 0; lVar17 != 0x48; lVar17 = lVar17 + 0x18) {
                *(double *)((long)pRVar5 + lVar17) =
                     *(double *)((long)pRVar10 + lVar17) + *(double *)((long)pRVar5 + lVar17);
              }
              pRVar5 = pRVar5 + 1;
              pRVar10 = pRVar10 + 1;
            }
            local_114 = 0;
            iVar18 = ref_cloud->n;
            RVar13 = -1;
            if (0 < iVar18) {
              RVar13 = *ref_cloud->global;
            }
            iVar11 = 0;
            while (lVar12 = (long)iVar11, (int)local_114 < iVar18) {
              if (RVar13 != local_f8) {
                dVar19 = ref_cloud->aux[(long)(int)local_114 * (long)ref_cloud->naux + 3];
                pdVar14 = pRVar4 + lVar12;
                for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
                  ab[lVar12 + 9] = *pdVar14 * (dVar19 - xyzs[3]) + ab[lVar12 + 9];
                  pdVar14 = pdVar14 + uVar7;
                }
                iVar11 = iVar11 + 1;
              }
              local_114 = local_114 + 1;
              RVar13 = -1;
              if ((int)local_114 < iVar18) {
                RVar13 = ref_cloud->global[local_114];
              }
            }
            if (m == iVar11) {
              RVar3 = ref_matrix_solve_ab(3,4,ab);
              if (RVar3 != 0) {
                return RVar3;
              }
              for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
                local_f0[lVar12] = ab[lVar12 + 9];
              }
              free(r);
              free(pRVar4);
              free(local_108);
              return 0;
            }
            pcVar16 = "b row miscount";
            uVar8 = 0x640;
            goto LAB_001a141e;
          }
          pcVar16 = "kexact lsq hess qr";
          uVar8 = 0x62f;
          goto LAB_001a1125;
        }
        pcVar16 = "malloc r of REF_DBL NULL";
        uVar8 = 0x61b;
        local_e8 = (REF_DBL *)0x0;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar8,
           "ref_recon_kexact_rs",pcVar16);
    uVar2 = 2;
  }
  else {
    pcVar16 = "missing center";
    uVar8 = 0x60a;
LAB_001a1125:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar8,
           "ref_recon_kexact_rs",(ulong)uVar2,pcVar16);
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_recon_kexact_rs(REF_GLOB center_global,
                                       REF_CLOUD ref_cloud, REF_DBL *rn,
                                       REF_DBL *sn, REF_DBL *hessian) {
  REF_DBL geom[3], ab[12];
  REF_DBL dxyz[3], dq, dr, ds;
  REF_DBL *a, *q, *r;
  REF_INT m, n;
  REF_GLOB cloud_global;
  REF_INT item, im, i, j;
  REF_DBL xyzs[4];
  REF_BOOL verbose = REF_FALSE;

  RSS(ref_cloud_item(ref_cloud, center_global, &item), "missing center");
  each_ref_cloud_aux(ref_cloud, i) {
    xyzs[i] = ref_cloud_aux(ref_cloud, i, item);
  }
  /* solve A with QR factorization size m x n */
  m = ref_cloud_n(ref_cloud) - 1; /* skip self */
  n = 3;
  if (verbose)
    printf("m %d at %f %f %f %f\n", m, xyzs[0], xyzs[1], xyzs[2], xyzs[3]);
  if (verbose)
    printf("r %f %f %f\ns %f %f %f\n", rn[0], rn[1], rn[2], sn[0], sn[1],
           sn[2]);
  if (m < n) {           /* underdetermined, will end badly */
    return REF_DIV_ZERO; /* signal cloud growth required */
  }
  ref_malloc(a, m * n, REF_DBL);
  ref_malloc(q, m * n, REF_DBL);
  ref_malloc(r, n * n, REF_DBL);
  i = 0;
  each_ref_cloud_global(ref_cloud, item, cloud_global) {
    if (center_global == cloud_global) continue; /* skip self */
    dxyz[0] = ref_cloud_aux(ref_cloud, 0, item) - xyzs[0];
    dxyz[1] = ref_cloud_aux(ref_cloud, 1, item) - xyzs[1];
    dxyz[2] = ref_cloud_aux(ref_cloud, 2, item) - xyzs[2];
    dr = ref_math_dot(dxyz, rn);
    ds = ref_math_dot(dxyz, sn);
    geom[0] = 0.5 * dr * dr;
    geom[1] = dr * ds;
    geom[2] = 0.5 * ds * ds;
    for (j = 0; j < n; j++) {
      a[i + m * j] = geom[j];
      if (verbose) printf(" %12.4e", geom[j]);
    }
    if (verbose) printf(" %f %f %d\n", dr, ds, i);
    i++;
  }
  REIS(m, i, "A row miscount");
  RSS(ref_matrix_qr(m, n, a, q, r), "kexact lsq hess qr");
  if (verbose) RSS(ref_matrix_show_aqr(m, n, a, q, r), "show qr");
  for (i = 0; i < (n + 1) * n; i++) ab[i] = 0.0;
  for (i = 0; i < n; i++) {
    for (j = 0; j < n; j++) {
      ab[i + n * j] += r[i + n * j];
    }
  }
  i = 0;
  each_ref_cloud_global(ref_cloud, item, cloud_global) {
    if (center_global == cloud_global) continue; /* skip self */
    dq = ref_cloud_aux(ref_cloud, 3, item) - xyzs[3];
    for (j = 0; j < n; j++) {
      ab[j + n * n] += q[i + m * j] * dq;
    }
    i++;
  }
  REIS(m, i, "b row miscount");
  if (verbose) RSS(ref_matrix_show_ab(n, n + 1, ab), "show");
  RAISE(ref_matrix_solve_ab(n, n + 1, ab));
  if (verbose) RSS(ref_matrix_show_ab(n, n + 1, ab), "show");
  j = n;
  for (im = 0; im < 3; im++) {
    hessian[im] = ab[im + n * j];
  }
  ref_free(r);
  ref_free(q);
  ref_free(a);

  return REF_SUCCESS;
}